

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O3

void __thiscall cmLBDepend::DependWalk(cmLBDepend *this,cmDependInformation *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  char cVar9;
  pointer pbVar10;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string line;
  string cxxFile;
  string root;
  string includeFile;
  string currentline;
  ifstream fin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  cmLBDepend *local_2b0;
  cmDependInformation *local_2a8;
  long *local_2a0;
  long local_298;
  long local_290 [2];
  long *local_280;
  long local_278;
  long local_270 [2];
  long *local_260 [2];
  long local_250 [2];
  RegularExpression *local_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(info->FullPath)._M_dataplus._M_p,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    local_2f0._M_string_length = 0;
    local_2f0.field_2._M_local_buf[0] = '\0';
    local_240 = &this->IncludeFileRegularExpression;
    paVar1 = &local_310.field_2;
    local_2b0 = this;
    local_2a8 = info;
    while( true ) {
      bVar4 = cmsys::SystemTools::GetLineFromStream((istream *)local_238,&local_2f0,(bool *)0x0,-1);
      _Var3._M_p = local_2f0._M_dataplus._M_p;
      if (!bVar4) break;
      iVar7 = strncmp(local_2f0._M_dataplus._M_p,"#include",8);
      if (iVar7 == 0) {
        local_260[0] = local_250;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_260,_Var3._M_p,_Var3._M_p + local_2f0._M_string_length);
        cVar9 = (char)(string *)local_260;
        lVar8 = std::__cxx11::string::find(cVar9,0x22);
        if (lVar8 == -1) {
          lVar8 = std::__cxx11::string::find(cVar9,0x3c);
          if (lVar8 != -1) {
            bVar5 = 0x3e;
            goto LAB_002eb0e3;
          }
          cmSystemTools::Error
                    ("unknown include directive ",(char *)local_260[0],(char *)0x0,(char *)0x0);
        }
        else {
          bVar5 = 0x22;
LAB_002eb0e3:
          std::__cxx11::string::find((char)local_260,(ulong)bVar5);
          std::__cxx11::string::substr((ulong)&local_280,(ulong)local_260);
          bVar4 = cmsys::RegularExpression::find(local_240,(char *)local_280);
          if (bVar4) {
            AddDependency(this,local_2a8,(char *)local_280);
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2d0,local_280,(long)local_280 + local_278);
            lVar8 = std::__cxx11::string::rfind((char)&local_2d0,0x2e);
            if (lVar8 != -1) {
              std::__cxx11::string::substr((ulong)&local_2a0,(ulong)&local_2d0);
              local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_330,local_2a0,local_298 + (long)local_2a0);
              std::__cxx11::string::append((char *)&local_330);
              std::__cxx11::string::operator=((string *)&local_2d0,(string *)&local_330);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330._M_dataplus._M_p != &local_330.field_2) {
                operator_delete(local_330._M_dataplus._M_p,
                                local_330.field_2._M_allocated_capacity + 1);
              }
              bVar4 = cmsys::SystemTools::FileExists(local_2d0._M_dataplus._M_p);
              for (pbVar10 = (this->IncludeDirectories).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  pbVar10 !=
                  (this->IncludeDirectories).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar10 = pbVar10 + 1) {
                local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
                pcVar2 = (pbVar10->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_330,pcVar2,pcVar2 + pbVar10->_M_string_length);
                local_310._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_310,local_330._M_dataplus._M_p,
                           local_330._M_dataplus._M_p + local_330._M_string_length);
                std::__cxx11::string::append((char *)&local_310);
                std::__cxx11::string::operator=((string *)&local_330,(string *)&local_310);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_310._M_dataplus._M_p != paVar1) {
                  operator_delete(local_310._M_dataplus._M_p,
                                  local_310.field_2._M_allocated_capacity + 1);
                }
                std::operator+(&local_310,&local_330,&local_2d0);
                std::__cxx11::string::operator=((string *)&local_330,(string *)&local_310);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_310._M_dataplus._M_p != paVar1) {
                  operator_delete(local_310._M_dataplus._M_p,
                                  local_310.field_2._M_allocated_capacity + 1);
                }
                bVar6 = cmsys::SystemTools::FileExists(local_330._M_dataplus._M_p);
                this = local_2b0;
                if (bVar6) {
                  bVar4 = true;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_330._M_dataplus._M_p != &local_330.field_2) {
                  operator_delete(local_330._M_dataplus._M_p,
                                  local_330.field_2._M_allocated_capacity + 1);
                }
              }
              if (bVar4 == false) {
                local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_330,local_2a0,local_298 + (long)local_2a0);
                std::__cxx11::string::append((char *)&local_330);
                std::__cxx11::string::operator=((string *)&local_2d0,(string *)&local_330);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_330._M_dataplus._M_p != &local_330.field_2) {
                  operator_delete(local_330._M_dataplus._M_p,
                                  local_330.field_2._M_allocated_capacity + 1);
                }
                bVar6 = cmsys::SystemTools::FileExists(local_2d0._M_dataplus._M_p);
                if (bVar6) {
                  bVar4 = true;
                }
                for (pbVar10 = (this->IncludeDirectories).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    pbVar10 !=
                    (this->IncludeDirectories).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar10 = pbVar10 + 1) {
                  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
                  pcVar2 = (pbVar10->_M_dataplus)._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_330,pcVar2,pcVar2 + pbVar10->_M_string_length);
                  local_310._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_310,local_330._M_dataplus._M_p,
                             local_330._M_dataplus._M_p + local_330._M_string_length);
                  std::__cxx11::string::append((char *)&local_310);
                  std::__cxx11::string::operator=((string *)&local_330,(string *)&local_310);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_310._M_dataplus._M_p != paVar1) {
                    operator_delete(local_310._M_dataplus._M_p,
                                    local_310.field_2._M_allocated_capacity + 1);
                  }
                  std::operator+(&local_310,&local_330,&local_2d0);
                  std::__cxx11::string::operator=((string *)&local_330,(string *)&local_310);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_310._M_dataplus._M_p != paVar1) {
                    operator_delete(local_310._M_dataplus._M_p,
                                    local_310.field_2._M_allocated_capacity + 1);
                  }
                  bVar6 = cmsys::SystemTools::FileExists(local_330._M_dataplus._M_p);
                  this = local_2b0;
                  if (bVar6) {
                    bVar4 = true;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_330._M_dataplus._M_p != &local_330.field_2) {
                    operator_delete(local_330._M_dataplus._M_p,
                                    local_330.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              if (bVar4 == false) {
                local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_330,local_2a0,local_298 + (long)local_2a0);
                std::__cxx11::string::append((char *)&local_330);
                std::__cxx11::string::operator=((string *)&local_2d0,(string *)&local_330);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_330._M_dataplus._M_p != &local_330.field_2) {
                  operator_delete(local_330._M_dataplus._M_p,
                                  local_330.field_2._M_allocated_capacity + 1);
                }
                bVar6 = cmsys::SystemTools::FileExists(local_2d0._M_dataplus._M_p);
                if (bVar6) {
                  bVar4 = true;
                }
                for (pbVar10 = (this->IncludeDirectories).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    pbVar10 !=
                    (this->IncludeDirectories).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar10 = pbVar10 + 1) {
                  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
                  pcVar2 = (pbVar10->_M_dataplus)._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_330,pcVar2,pcVar2 + pbVar10->_M_string_length);
                  local_310._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_310,local_330._M_dataplus._M_p,
                             local_330._M_dataplus._M_p + local_330._M_string_length);
                  std::__cxx11::string::append((char *)&local_310);
                  std::__cxx11::string::operator=((string *)&local_330,(string *)&local_310);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_310._M_dataplus._M_p != paVar1) {
                    operator_delete(local_310._M_dataplus._M_p,
                                    local_310.field_2._M_allocated_capacity + 1);
                  }
                  std::operator+(&local_310,&local_330,&local_2d0);
                  std::__cxx11::string::operator=((string *)&local_330,(string *)&local_310);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_310._M_dataplus._M_p != paVar1) {
                    operator_delete(local_310._M_dataplus._M_p,
                                    local_310.field_2._M_allocated_capacity + 1);
                  }
                  bVar6 = cmsys::SystemTools::FileExists(local_330._M_dataplus._M_p);
                  this = local_2b0;
                  if (bVar6) {
                    bVar4 = true;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_330._M_dataplus._M_p != &local_330.field_2) {
                    operator_delete(local_330._M_dataplus._M_p,
                                    local_330.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              if (bVar4 == false) {
                local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_330,local_2a0,local_298 + (long)local_2a0);
                std::__cxx11::string::append((char *)&local_330);
                std::__cxx11::string::operator=((string *)&local_2d0,(string *)&local_330);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_330._M_dataplus._M_p != &local_330.field_2) {
                  operator_delete(local_330._M_dataplus._M_p,
                                  local_330.field_2._M_allocated_capacity + 1);
                }
                bVar6 = cmsys::SystemTools::FileExists(local_2d0._M_dataplus._M_p);
                if (bVar6) {
                  bVar4 = true;
                }
                for (pbVar10 = (this->IncludeDirectories).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    pbVar10 !=
                    (this->IncludeDirectories).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar10 = pbVar10 + 1) {
                  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
                  pcVar2 = (pbVar10->_M_dataplus)._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_330,pcVar2,pcVar2 + pbVar10->_M_string_length);
                  local_310._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_310,local_330._M_dataplus._M_p,
                             local_330._M_dataplus._M_p + local_330._M_string_length);
                  std::__cxx11::string::append((char *)&local_310);
                  std::__cxx11::string::operator=((string *)&local_330,(string *)&local_310);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_310._M_dataplus._M_p != paVar1) {
                    operator_delete(local_310._M_dataplus._M_p,
                                    local_310.field_2._M_allocated_capacity + 1);
                  }
                  std::operator+(&local_310,&local_330,&local_2d0);
                  std::__cxx11::string::operator=((string *)&local_330,(string *)&local_310);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_310._M_dataplus._M_p != paVar1) {
                    operator_delete(local_310._M_dataplus._M_p,
                                    local_310.field_2._M_allocated_capacity + 1);
                  }
                  bVar6 = cmsys::SystemTools::FileExists(local_330._M_dataplus._M_p);
                  this = local_2b0;
                  if (bVar6) {
                    bVar4 = true;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_330._M_dataplus._M_p != &local_330.field_2) {
                    operator_delete(local_330._M_dataplus._M_p,
                                    local_330.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              if (bVar4 != false) {
                AddDependency(this,local_2a8,local_2d0._M_dataplus._M_p);
              }
              if (local_2a0 != local_290) {
                operator_delete(local_2a0,local_290[0] + 1);
              }
            }
LAB_002eb3fe:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else if (this->Verbose == true) {
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"Skipping ","");
            std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_280);
            std::__cxx11::string::append((char *)&local_2d0);
            std::__cxx11::string::append((char *)&local_2d0);
            cmSystemTools::Error(local_2d0._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
            goto LAB_002eb3fe;
          }
          if (local_280 != local_270) {
            operator_delete(local_280,local_270[0] + 1);
          }
        }
        if (local_260[0] != local_250) {
          operator_delete(local_260[0],local_250[0] + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,
                      CONCAT71(local_2f0.field_2._M_allocated_capacity._1_7_,
                               local_2f0.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    cmSystemTools::Error
              ("error can not open ",(info->FullPath)._M_dataplus._M_p,(char *)0x0,(char *)0x0);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void DependWalk(cmDependInformation* info)
  {
    cmsys::ifstream fin(info->FullPath.c_str());
    if(!fin)
      {
      cmSystemTools::Error("error can not open ", info->FullPath.c_str());
      return;
      }

    std::string line;
    while(cmSystemTools::GetLineFromStream(fin, line))
      {
      if(cmHasLiteralPrefix(line.c_str(), "#include"))
        {
        // if it is an include line then create a string class
        std::string currentline = line;
        size_t qstart = currentline.find('\"', 8);
        size_t qend;
        // if a quote is not found look for a <
        if(qstart == std::string::npos)
          {
          qstart = currentline.find('<', 8);
          // if a < is not found then move on
          if(qstart == std::string::npos)
            {
            cmSystemTools::Error("unknown include directive ",
                                 currentline.c_str() );
            continue;
            }
          else
            {
            qend = currentline.find('>', qstart+1);
            }
          }
        else
          {
          qend = currentline.find('\"', qstart+1);
          }
        // extract the file being included
        std::string includeFile =
          currentline.substr(qstart+1, qend - qstart-1);
        // see if the include matches the regular expression
        if(!this->IncludeFileRegularExpression.find(includeFile))
          {
          if(this->Verbose)
            {
            std::string message = "Skipping ";
            message += includeFile;
            message += " for file ";
            message += info->FullPath.c_str();
            cmSystemTools::Error(message.c_str(), 0);
            }
          continue;
          }

        // Add this file and all its dependencies.
        this->AddDependency(info, includeFile.c_str());
        /// add the cxx file if it exists
        std::string cxxFile = includeFile;
        std::string::size_type pos = cxxFile.rfind('.');
        if(pos != std::string::npos)
          {
          std::string root = cxxFile.substr(0, pos);
          cxxFile = root + ".cxx";
          bool found = false;
          // try jumping to .cxx .cpp and .c in order
          if(cmSystemTools::FileExists(cxxFile.c_str()))
            {
            found = true;
            }
          for(std::vector<std::string>::iterator i =
              this->IncludeDirectories.begin();
              i != this->IncludeDirectories.end(); ++i)
            {
            std::string path = *i;
            path = path + "/";
            path = path + cxxFile;
            if(cmSystemTools::FileExists(path.c_str()))
              {
              found = true;
              }
            }
          if (!found)
            {
            cxxFile = root + ".cpp";
            if(cmSystemTools::FileExists(cxxFile.c_str()))
              {
              found = true;
              }
            for(std::vector<std::string>::iterator i =
                this->IncludeDirectories.begin();
                i != this->IncludeDirectories.end(); ++i)
              {
              std::string path = *i;
              path = path + "/";
              path = path + cxxFile;
              if(cmSystemTools::FileExists(path.c_str()))
                {
                found = true;
                }
              }
            }
          if (!found)
            {
            cxxFile = root + ".c";
            if(cmSystemTools::FileExists(cxxFile.c_str()))
              {
              found = true;
              }
            for(std::vector<std::string>::iterator i =
                this->IncludeDirectories.begin();
                i != this->IncludeDirectories.end(); ++i)
              {
              std::string path = *i;
              path = path + "/";
              path = path + cxxFile;
              if(cmSystemTools::FileExists(path.c_str()))
                {
                found = true;
                }
              }
            }
          if (!found)
            {
            cxxFile = root + ".txx";
            if(cmSystemTools::FileExists(cxxFile.c_str()))
              {
              found = true;
              }
            for(std::vector<std::string>::iterator i =
                this->IncludeDirectories.begin();
                i != this->IncludeDirectories.end(); ++i)
              {
              std::string path = *i;
              path = path + "/";
              path = path + cxxFile;
              if(cmSystemTools::FileExists(path.c_str()))
                {
                found = true;
                }
              }
            }
          if (found)
            {
            this->AddDependency(info, cxxFile.c_str());
            }
          }
        }
      }
  }